

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkvstore_test.cc
# Opt level: O0

int test_describe_price(void)

{
  code *pcVar1;
  char *__s;
  RkvstoreDescribePriceRequestType *pRVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_289;
  int ret;
  HttpTestListener *local_268;
  HttpTestListener *listener;
  string local_258;
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [55];
  allocator<char> local_1d1;
  string local_1d0 [32];
  RkvstoreDescribePriceRequestType *local_1b0;
  Rkvstore *rkvstore;
  RkvstoreDescribePriceResponseType resp;
  RkvstoreDescribePriceRequestType req;
  
  aliyun::RkvstoreDescribePriceRequestType::RkvstoreDescribePriceRequestType
            ((RkvstoreDescribePriceRequestType *)&resp.order.discount_amount);
  aliyun::RkvstoreDescribePriceResponseType::RkvstoreDescribePriceResponseType
            ((RkvstoreDescribePriceResponseType *)&rkvstore);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"cn-hangzhou",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"my_appid",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_230,"my_secret",&local_231);
  pRVar2 = (RkvstoreDescribePriceRequestType *)
           aliyun::Rkvstore::CreateRkvstoreClient(local_1d0,local_208,local_230);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  local_1b0 = pRVar2;
  if (pRVar2 == (RkvstoreDescribePriceRequestType *)0x0) {
    aliyun::RkvstoreDescribePriceResponseType::~RkvstoreDescribePriceResponseType
              ((RkvstoreDescribePriceResponseType *)&rkvstore);
    aliyun::RkvstoreDescribePriceRequestType::~RkvstoreDescribePriceRequestType
              ((RkvstoreDescribePriceRequestType *)&resp.order.discount_amount);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Rkvstore::SetProxyHost((Rkvstore *)pRVar2,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Rkvstore::SetUseTls((Rkvstore *)local_1b0,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_price_response;
  local_268 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_289);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_289);
  HttpTestListener::Start(local_268);
  std::__cxx11::string::operator=((string *)&resp.order.discount_amount,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=((string *)(req.owner_account.field_2._M_local_buf + 8),"Capacity")
  ;
  std::__cxx11::string::operator=((string *)(req.capacity.field_2._M_local_buf + 8),"OrderType");
  std::__cxx11::string::operator=((string *)(req.order_type.field_2._M_local_buf + 8),"ZoneId");
  std::__cxx11::string::operator=((string *)(req.zone_id.field_2._M_local_buf + 8),"ChargeType");
  std::__cxx11::string::operator=((string *)(req.charge_type.field_2._M_local_buf + 8),"Period");
  std::__cxx11::string::operator=((string *)(req.period.field_2._M_local_buf + 8),"Quantity");
  std::__cxx11::string::operator=((string *)(req.quantity.field_2._M_local_buf + 8),"InstanceId");
  aliyun::Rkvstore::DescribePrice
            (local_1b0,(RkvstoreDescribePriceResponseType *)&resp.order.discount_amount,
             (RkvstoreErrorInfo *)&rkvstore);
  HttpTestListener::WaitComplete(local_268);
  pHVar3 = local_268;
  if (local_268 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_268);
    operator_delete(pHVar3,0x180);
  }
  pRVar2 = local_1b0;
  if (local_1b0 != (RkvstoreDescribePriceRequestType *)0x0) {
    aliyun::Rkvstore::~Rkvstore((Rkvstore *)local_1b0);
    operator_delete(pRVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_price() {
  RkvstoreDescribePriceRequestType req;
  RkvstoreDescribePriceResponseType resp;
  Rkvstore* rkvstore = Rkvstore::CreateRkvstoreClient("cn-hangzhou", "my_appid", "my_secret");
  if(!rkvstore) return 0;
  rkvstore->SetProxyHost("127.0.0.1:12234");
  rkvstore->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_price_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.capacity = "Capacity";
  req.order_type = "OrderType";
  req.zone_id = "ZoneId";
  req.charge_type = "ChargeType";
  req.period = "Period";
  req.quantity = "Quantity";
  req.instance_id = "InstanceId";
  int ret = rkvstore->DescribePrice(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete rkvstore;
}